

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O0

bounded_buffer * peparse::readFileToFileBuffer(char *filePath)

{
  int iVar1;
  char *__s;
  void *__s_00;
  void *local_260;
  char *local_248;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  void *local_1f8;
  void *maddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [8];
  stat s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_d9;
  void *local_d8;
  void *local_d0;
  buffer_detail *d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_81;
  char *local_80;
  char *local_78;
  bounded_buffer *p;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  char *pcStack_18;
  int fd;
  char *filePath_local;
  
  pcStack_18 = filePath;
  local_1c = open(filePath,0);
  if (local_1c == -1) {
    err = 7;
    std::__cxx11::string::assign(err_loc_abi_cxx11_);
    to_string<unsigned_int>(&local_60,0xb8,std::dec);
    std::operator+(&local_40,":",&local_60);
    std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    filePath_local = (char *)0x0;
  }
  else {
    __s = (char *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    local_81 = 0;
    local_248 = (char *)0x0;
    if (__s != (char *)0x0) {
      local_81 = 1;
      local_80 = __s;
      memset(__s,0,0x18);
      local_248 = __s;
    }
    local_78 = local_248;
    if (local_248 == (char *)0x0) {
      err = 1;
      std::__cxx11::string::assign(err_loc_abi_cxx11_);
      to_string<unsigned_int>((string *)&d,0xc0,std::dec);
      std::operator+(&local_a8,":",(string *)&d);
      std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&d);
      filePath_local = (char *)0x0;
    }
    else {
      memset(local_248,0,0x18);
      __s_00 = operator_new(4,(nothrow_t *)&std::nothrow);
      local_d9 = 0;
      local_260 = (void *)0x0;
      if (__s_00 != (void *)0x0) {
        local_d9 = 1;
        local_d8 = __s_00;
        memset(__s_00,0,4);
        local_260 = __s_00;
      }
      local_d0 = local_260;
      if (local_260 == (void *)0x0) {
        if (local_78 != (char *)0x0) {
          operator_delete(local_78,0x18);
        }
        err = 1;
        std::__cxx11::string::assign(err_loc_abi_cxx11_);
        to_string<unsigned_int>((string *)(s.__glibc_reserved + 2),0xc9,std::dec);
        std::operator+(&local_100,":",(string *)(s.__glibc_reserved + 2));
        std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,(string *)&local_100);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)(s.__glibc_reserved + 2));
        filePath_local = (char *)0x0;
      }
      else {
        memset(local_260,0,4);
        *(void **)(local_78 + 0x10) = local_d0;
        **(int **)(local_78 + 0x10) = local_1c;
        memset(local_1b0,0,0x90);
        iVar1 = fstat(local_1c,(stat *)local_1b0);
        if (iVar1 == 0) {
          local_1f8 = mmap((void *)0x0,s.st_rdev,1,1,local_1c,0);
          if (local_1f8 == (void *)0xffffffffffffffff) {
            close(local_1c);
            if (local_d0 != (void *)0x0) {
              operator_delete(local_d0,4);
            }
            if (local_78 != (char *)0x0) {
              operator_delete(local_78,0x18);
            }
            err = 1;
            std::__cxx11::string::assign(err_loc_abi_cxx11_);
            to_string<unsigned_int>(&local_238,0xff,std::dec);
            std::operator+(&local_218,":",&local_238);
            std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,(string *)&local_218);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_238);
            filePath_local = (char *)0x0;
          }
          else {
            *(void **)local_78 = local_1f8;
            *(int *)(local_78 + 8) = (int)s.st_rdev;
            local_78[0xc] = '\0';
            local_78[0xd] = '\0';
            filePath_local = local_78;
          }
        }
        else {
          close(local_1c);
          if (local_d0 != (void *)0x0) {
            operator_delete(local_d0,4);
          }
          if (local_78 != (char *)0x0) {
            operator_delete(local_78,0x18);
          }
          err = 8;
          std::__cxx11::string::assign(err_loc_abi_cxx11_);
          to_string<unsigned_int>((string *)&maddr,0xf0,std::dec);
          std::operator+(&local_1d0,":",(string *)&maddr);
          std::__cxx11::string::operator+=((string *)err_loc_abi_cxx11_,(string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&maddr);
          filePath_local = (char *)0x0;
        }
      }
    }
  }
  return (bounded_buffer *)filePath_local;
}

Assistant:

bounded_buffer *readFileToFileBuffer(const char *filePath) {
#ifdef WIN32
  HANDLE h = CreateFileA(filePath,
                         GENERIC_READ,
                         FILE_SHARE_READ | FILE_SHARE_WRITE | FILE_SHARE_DELETE,
                         nullptr,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         nullptr);
  if (h == INVALID_HANDLE_VALUE) {
    return nullptr;
  }

  DWORD fileSize = GetFileSize(h, nullptr);

  if (fileSize == INVALID_FILE_SIZE) {
    CloseHandle(h);
    return nullptr;
  }

#else
  // only where we have mmap / open / etc
  int fd = open(filePath, O_RDONLY);

  if (fd == -1) {
    PE_ERR(PEERR_OPEN);
    return nullptr;
  }
#endif

  // make a buffer object
  bounded_buffer *p = new (std::nothrow) bounded_buffer();
  if (p == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  memset(p, 0, sizeof(bounded_buffer));
  buffer_detail *d = new (std::nothrow) buffer_detail();

  if (d == nullptr) {
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }
  memset(d, 0, sizeof(buffer_detail));
  p->detail = d;

// only where we have mmap / open / etc
#ifdef WIN32
  p->detail->file = h;

  HANDLE hMap = CreateFileMapping(h, nullptr, PAGE_READONLY, 0, 0, nullptr);

  if (hMap == nullptr) {
    CloseHandle(h);
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->detail->sec = hMap;

  LPVOID ptr = MapViewOfFile(hMap, FILE_MAP_READ, 0, 0, 0);

  if (ptr == nullptr) {
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->buf = (::uint8_t *) ptr;
  p->bufLen = fileSize;
#else
  p->detail->fd = fd;

  struct stat s;
  memset(&s, 0, sizeof(struct stat));

  if (fstat(fd, &s) != 0) {
    close(fd);
    delete d;
    delete p;
    PE_ERR(PEERR_STAT);
    return nullptr;
  }

  void *maddr = mmap(nullptr,
                     static_cast<std::size_t>(s.st_size),
                     PROT_READ,
                     MAP_SHARED,
                     fd,
                     0);

  if (maddr == MAP_FAILED) {
    close(fd);
    delete d;
    delete p;
    PE_ERR(PEERR_MEM);
    return nullptr;
  }

  p->buf = reinterpret_cast<std::uint8_t *>(maddr);
  p->bufLen = static_cast<std::uint32_t>(s.st_size);
#endif
  p->copy = false;
  p->swapBytes = false;

  return p;
}